

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O1

size_t helics::detail::getDataSize(byte *data)

{
  undefined4 uVar1;
  
  uVar1 = *(undefined4 *)(data + 4);
  return (ulong)((uint)uVar1 >> 0x18 | (uint)(uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                uVar1 << 0x18);
}

Assistant:

size_t getDataSize(const std::byte* data)
{
    return (std::to_integer<size_t>(data[4]) << 24U) + (std::to_integer<size_t>(data[5]) << 16U) +
        (std::to_integer<size_t>(data[6]) << 8U) + std::to_integer<size_t>(data[7]);
}